

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O2

int gc_color(lua_State *L)

{
  byte bVar1;
  StkId pTVar2;
  char *s;
  
  luaL_checkany(L,1);
  pTVar2 = L->ci->func;
  if ((short)pTVar2[1].tt_ < 0) {
    bVar1 = (pTVar2[1].value_.gc)->marked;
    if (((L->l_G->currentwhite ^ 0x18) & bVar1) == 0) {
      if ((bVar1 & 0x18) == 0) {
        s = "black";
        if ((bVar1 & 0x20) == 0) {
          s = "gray";
        }
      }
      else {
        s = "white";
      }
    }
    else {
      s = "dead";
    }
  }
  else {
    s = "no collectable";
  }
  lua_pushstring(L,s);
  return 1;
}

Assistant:

static int gc_color (lua_State *L) {
  TValue *o;
  luaL_checkany(L, 1);
  o = obj_at(L, 1);
  if (!iscollectable(o))
    lua_pushstring(L, "no collectable");
  else {
    GCObject *obj = gcvalue(o);
    lua_pushstring(L, isdead(G(L), obj) ? "dead" :
                      iswhite(obj) ? "white" :
                      isblack(obj) ? "black" : "gray");
  }
  return 1;
}